

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditTextureFormatTests.cpp
# Opt level: O2

ConstPixelBufferAccess * dit::anon_unknown_0::getInputAccess(TextureFormat format)

{
  bool bVar1;
  TextureFormat in_RSI;
  ConstPixelBufferAccess *in_RDI;
  long lVar2;
  TextureFormat format_00;
  TextureFormat local_50;
  IVec3 local_48;
  IVec3 local_3c;
  
  lVar2 = 0;
  do {
    format_00 = in_RSI;
    if (lVar2 == 0xc) break;
    format_00 = (TextureFormat)
                ((ulong)*(uint *)((long)&DAT_0022174c + lVar2) | (ulong)in_RSI & 0xffffffff00000000)
    ;
    bVar1 = tcu::isValid(format_00);
    lVar2 = lVar2 + 4;
  } while (!bVar1);
  local_48.m_data[0] = tcu::getPixelSize(format_00);
  lVar2 = ((ulong)in_RSI >> 0x20) * 0x28;
  local_3c.m_data[0] =
       *(int *)((anonymous_namespace)::s_formatData + lVar2 + 8) / local_48.m_data[0];
  local_3c.m_data[1] = 1;
  local_3c.m_data[2] = 1;
  local_48.m_data[1] = 0;
  local_48.m_data[2] = 0;
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (in_RDI,&local_50,&local_3c,&local_48,
             *(void **)((anonymous_namespace)::s_formatData + lVar2));
  return in_RDI;
}

Assistant:

ConstPixelBufferAccess getInputAccess (TextureFormat format)
{
	const TextureFormat	inputFormat		= getBaseFormat(format);
	const int			inputPixelSize	= getPixelSize(inputFormat);
	const int			numPixels		= s_formatData[format.type].inputSize / inputPixelSize;

	DE_ASSERT(numPixels == 4);
	DE_ASSERT(numPixels*inputPixelSize == s_formatData[format.type].inputSize);

	return ConstPixelBufferAccess(format, IVec3(numPixels, 1, 1), IVec3(inputPixelSize, 0, 0), s_formatData[format.type].input);
}